

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O1

void __thiscall PcodeGenerator::MergeSelfAssign(PcodeGenerator *this)

{
  vector<Pcode,_std::allocator<Pcode>_> *this_00;
  PcodeType PVar1;
  pointer pcVar2;
  pointer pPVar3;
  _Alloc_hider _Var4;
  int iVar5;
  iterator iter;
  iterator __position;
  ulong uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  string num1;
  int local_74;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  string local_50;
  
  this_00 = &this->m_pcode_queue;
  do {
    __position._M_current =
         (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
         super__Vector_impl_data._M_start;
    bVar9 = true;
    if ((long)(this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__position._M_current != 0x88) {
      uVar6 = 0;
      local_74 = 0;
      iVar8 = 0;
      do {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = __position._M_current[uVar6].m_num1._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,
                   pcVar2 + __position._M_current[uVar6].m_num1._M_string_length);
        iVar7 = iVar8 + 1;
        pPVar3 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_70 = local_60;
        _Var4._M_p = pPVar3[iVar7].m_num2._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,_Var4._M_p,_Var4._M_p + pPVar3[iVar7].m_num2._M_string_length
                  );
        if ((local_50._M_string_length == local_68) &&
           ((local_50._M_string_length == 0 ||
            (iVar5 = bcmp(local_50._M_dataplus._M_p,local_70,local_50._M_string_length), iVar5 == 0)
            ))) {
          PVar1 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar7].m_op;
          if (local_70 != local_60) {
            operator_delete(local_70);
          }
          if (((PVar1 == ASSIGN) && (bVar9 = GlobalJudge(&local_50), !bVar9)) &&
             (bVar9 = FPJudge(&local_50), !bVar9)) {
            pPVar3 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_70 = local_60;
            _Var4._M_p = pPVar3[iVar7].m_num1._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,_Var4._M_p,
                       _Var4._M_p + pPVar3[iVar7].m_num1._M_string_length);
            std::__cxx11::string::_M_assign((string *)&pPVar3[uVar6].m_num1);
            if (local_70 != local_60) {
              operator_delete(local_70);
            }
            (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar7].m_op = NOP;
            local_74 = local_74 + 1;
            iVar8 = iVar7;
          }
        }
        else if (local_70 != local_60) {
          operator_delete(local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        iVar8 = iVar8 + 1;
        uVar6 = (ulong)iVar8;
        __position._M_current =
             (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_start;
      } while (uVar6 < ((long)(this->m_pcode_queue).
                              super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)__position._M_current >> 3)
                       * -0xf0f0f0f0f0f0f0f - 1U);
      bVar9 = local_74 == 0;
    }
    while (__position._M_current !=
           (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      if ((__position._M_current)->m_op == NOP) {
        __position = std::vector<Pcode,_std::allocator<Pcode>_>::_M_erase(this_00,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    }
  } while (!bVar9);
  return;
}

Assistant:

void PcodeGenerator::MergeSelfAssign() {
    int count;
    do {
        count = 0;
        for (int i=0; i<m_pcode_queue.size()-1; ++i) {
            string num1 = m_pcode_queue[i].GetNum1();
            if (num1 == m_pcode_queue[i+1].GetNum2() && m_pcode_queue[i+1].GetOP() == ASSIGN) {
                if (GlobalJudge(num1) || FPJudge(num1))
                    continue;
                m_pcode_queue[i].SetNum1(m_pcode_queue[i+1].GetNum1());
                m_pcode_queue[i+1].SetOP(NOP);
                i++;
                count++;
            }
        }
        for (auto iter = m_pcode_queue.begin(); iter != m_pcode_queue.end();) {
            if (iter->GetOP() == NOP) {
                iter = m_pcode_queue.erase(iter);
            } else {
                iter++;
            }
        }
    } while (count != 0);
}